

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.h
# Opt level: O0

alias_table_internal_table * alias_table_internal_create(uint32_t capacity)

{
  pthread_mutex_t *x;
  alias_table_internal_table_cell_struct *paVar1;
  alias_table_internal_table *table;
  uint32_t capacity_local;
  
  x = (pthread_mutex_t *)calloc(1,0x48);
  init_recursive_mutex(x);
  paVar1 = alias_table_internalalloc_cells((alias_table_internal_table *)&x->__data,capacity);
  *(alias_table_internal_table_cell_struct **)((long)x + 0x40) = paVar1;
  x[1].__data.__lock = capacity;
  return (alias_table_internal_table *)x;
}

Assistant:

static PREFIX(_table) *PREFIX(_create)(uint32_t capacity)
{
	PREFIX(_table) *table = CALLOC(1, sizeof(PREFIX(_table)));
#	ifndef MAP_TABLE_NO_LOCK
	INIT_LOCK(table->lock);
#	endif
#	if defined(ENABLE_GC) && defined(MAP_TABLE_TYPES_BITMAP)
	// The low word in the bitmap stores the offsets of the next entries
	GC_word bitmap = (MAP_TABLE_TYPES_BITMAP << 1);
	table->descr = GC_make_descriptor(&bitmap,
			sizeof(struct PREFIX(_table_cell_struct)) / sizeof (void*));
#	endif
	table->table = PREFIX(alloc_cells)(table, capacity);
	table->table_size = capacity;
	return table;
}